

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_get_indexOutOfBounds_fn(int _i)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"01234567",0x10);
  private_ACUtilsTest_AString_reallocFail = 0;
  cVar1 = AString_get(&string,8);
  if (cVar1 != '\0') {
    string.size = (size_t)cVar1;
    pcVar6 = "\'\\0\'";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "AString_get(&string, 8) == \'\\0\'";
    pcVar5 = "AString_get(&string, 8)";
    iVar2 = 0x470;
    goto LAB_0012f534;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x470);
  if (string.capacity == 0x10) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x471);
    if (string.buffer == (char *)0x0) {
      string.size = 0;
      pcVar6 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (string).buffer != NULL";
      pcVar5 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x471);
      pcVar6 = string.buffer;
      if (string.buffer == (char *)0x0) {
        string.size = 0x16819b;
        pcVar6 = "(null)";
      }
      else {
        iVar2 = strcmp("01234567",string.buffer);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x471);
          if (string.size != 8) {
            pcVar6 = "strlen(\"01234567\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).size == strlen(\"01234567\")";
            pcVar5 = "(string).size";
            goto LAB_0012f1ab;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x471);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            pcVar6 = "(0)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar5 = "private_ACUtilsTest_AString_reallocCount";
            iVar2 = 0x472;
            string.size = private_ACUtilsTest_AString_reallocCount;
            goto LAB_0012f534;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x472);
          cVar1 = AString_get(&string,0xf);
          if (cVar1 != '\0') {
            pcVar6 = "\'\\0\'";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "AString_get(&string, 15) == \'\\0\'";
            pcVar5 = "AString_get(&string, 15)";
            iVar2 = 0x473;
            string.size = (size_t)(long)cVar1;
            goto LAB_0012f534;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x473);
          if (string.capacity == 0x10) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x474);
            if (string.buffer == (char *)0x0) {
              string.size = 0;
              pcVar6 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar4 = "(void*) (string).buffer != NULL";
              pcVar5 = "(void*) (string).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x474);
              pcVar6 = string.buffer;
              if (string.buffer == (char *)0x0) {
                string.size = 0x16819b;
                pcVar6 = "(null)";
              }
              else {
                iVar2 = strcmp("01234567",string.buffer);
                if (iVar2 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x474);
                  if (string.size != 8) {
                    pcVar6 = "strlen(\"01234567\")";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "(string).size == strlen(\"01234567\")";
                    pcVar5 = "(string).size";
                    goto LAB_0012f36d;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x474);
                  if (private_ACUtilsTest_AString_reallocCount != 0) {
                    pcVar6 = "(0)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar5 = "private_ACUtilsTest_AString_reallocCount";
                    iVar2 = 0x475;
                    string.size = private_ACUtilsTest_AString_reallocCount;
                    goto LAB_0012f534;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x475);
                  cVar1 = AString_get(&string,0x29a);
                  if (cVar1 != '\0') {
                    pcVar6 = "\'\\0\'";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "AString_get(&string, 666) == \'\\0\'";
                    pcVar5 = "AString_get(&string, 666)";
                    iVar2 = 0x476;
                    string.size = (size_t)(long)cVar1;
                    goto LAB_0012f534;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x476);
                  if (string.capacity == 0x10) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x477);
                    if (string.buffer == (char *)0x0) {
                      string.size = 0;
                      pcVar6 = (char *)0x0;
                      expr = "Assertion \'_ck_x != NULL\' failed";
                      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                      pcVar4 = "(void*) (string).buffer != NULL";
                      pcVar5 = "(void*) (string).buffer";
                    }
                    else {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x477);
                      pcVar6 = string.buffer;
                      if (string.buffer == (char *)0x0) {
                        pcVar6 = "(null)";
                        string.size = 0x16819b;
                      }
                      else {
                        iVar2 = strcmp("01234567",string.buffer);
                        if (iVar2 == 0) {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x477);
                          if (string.size == 8) {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x477);
                            if (private_ACUtilsTest_AString_reallocCount == 0) {
                              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x478);
                              (*string.deallocator)(string.buffer);
                              return;
                            }
                            pcVar6 = "(0)";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
                            pcVar5 = "private_ACUtilsTest_AString_reallocCount";
                            iVar2 = 0x478;
                            string.size = private_ACUtilsTest_AString_reallocCount;
                            goto LAB_0012f534;
                          }
                          pcVar6 = "strlen(\"01234567\")";
                          expr = "Assertion \'_ck_x == _ck_y\' failed";
                          pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                          pcVar4 = "(string).size == strlen(\"01234567\")";
                          pcVar5 = "(string).size";
                          goto LAB_0012f52f;
                        }
                        string.size = 0x15c553;
                      }
                      expr = 
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ;
                      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                      pcVar4 = "(string).buffer == (\"01234567\")";
                      pcVar5 = "(string).buffer";
                    }
                  }
                  else {
                    pcVar6 = "(16)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "(string).capacity == (16)";
                    pcVar5 = "(string).capacity";
                    string.size = string.capacity;
                  }
LAB_0012f52f:
                  iVar2 = 0x477;
                  goto LAB_0012f534;
                }
                string.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar4 = "(string).buffer == (\"01234567\")";
              pcVar5 = "(string).buffer";
            }
          }
          else {
            pcVar6 = "(16)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).capacity == (16)";
            pcVar5 = "(string).capacity";
            string.size = string.capacity;
          }
LAB_0012f36d:
          iVar2 = 0x474;
          goto LAB_0012f534;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(string).buffer == (\"01234567\")";
      pcVar5 = "(string).buffer";
    }
  }
  else {
    pcVar6 = "(16)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(string).capacity == (16)";
    pcVar5 = "(string).capacity";
    string.size = string.capacity;
  }
LAB_0012f1ab:
  iVar2 = 0x471;
LAB_0012f534:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar4,pcVar5,string.size,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_AString_get_indexOutOfBounds)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("01234567", 16);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT_UINT_EQ(AString_get(&string, 8), '\0');
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234567", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_UINT_EQ(AString_get(&string, 15), '\0');
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234567", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_UINT_EQ(AString_get(&string, 666), '\0');
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234567", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}